

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_&>
__thiscall
kj::
Table<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>>
::find<0ul,kj::StringPtr&>
          (Table<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>>
           *this,StringPtr *params)

{
  char *pcVar1;
  ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
  table;
  HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
  local_28 [8];
  long local_20;
  
  table.ptr = (Entry *)(params + 2);
  pcVar1 = (params->content).ptr;
  table.size_ = (size_t)pcVar1;
  HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
  ::
  find<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_const,kj::StringPtr&>
            (local_28,table,(StringPtr *)((long)((params->content).size_ - (long)pcVar1) / 0x38));
  if (local_28[0] ==
      (HashIndex<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>
       )0x1) {
    pcVar1 = (params->content).ptr + local_20 * 0x38;
  }
  else {
    pcVar1 = (char *)0x0;
  }
  *(char **)this = pcVar1;
  return (Maybe<const_kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry_&>
          )(Entry *)this;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}